

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AsmJsTypes.cpp
# Opt level: O1

ArgSlot __thiscall
Js::AsmJsFunctionDeclaration::GetArgByteSize(AsmJsFunctionDeclaration *this,ArgSlot inArgCount)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  
  if ((this->super_AsmJsSymbol).mType == ImportFunction) {
    if (inArgCount == 0xffff) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar3 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar3 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/AsmJsTypes.cpp"
                                  ,0x24e,"(inArgCount != Constants::InvalidArgSlot)",
                                  "inArgCount != Constants::InvalidArgSlot");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      *puVar3 = 0;
    }
    if (inArgCount < 0x2000) {
LAB_009665d9:
      return inArgCount << 3;
    }
  }
  else {
    inArgCount = this->mArgCount;
    if (inArgCount < 0x2000) goto LAB_009665d9;
  }
  ::Math::DefaultOverflowPolicy();
}

Assistant:

ArgSlot AsmJsFunctionDeclaration::GetArgByteSize(ArgSlot inArgCount) const
    {
        ArgSlot argSize = 0;
        if (AsmJsImportFunction::Is(this))
        {
            Assert(inArgCount != Constants::InvalidArgSlot);
            argSize = ArgSlotMath::Mul(inArgCount, (uint16)MachPtr);
        }
#if _M_IX86
        else
        {
            for (ArgSlot i = 0; i < GetArgCount(); i++)
            {
                if( GetArgType(i).isMaybeDouble() )
                {
                    argSize = ArgSlotMath::Add(argSize, sizeof(double));
                }
                else if (GetArgType(i).isIntish())
                {
                    argSize = ArgSlotMath::Add(argSize, sizeof(int));
                }
                else if (GetArgType(i).isFloatish())
                {
                    argSize = ArgSlotMath::Add(argSize, sizeof(float));
                }
                else
                {
                    AssertOrFailFast(UNREACHED);
                }
            }
        }
#elif _M_X64
        else
        {
            argSize = ArgSlotMath::Mul(GetArgCount(), (uint16)MachPtr);
        }
#else
        AssertOrFailFast(UNREACHED);
#endif
        return argSize;
    }

    AsmJsMathFunction::AsmJsMathFunction( PropertyName name, ArenaAllocator* allocator, ArgSlot argCount, AsmJSMathBuiltinFunction builtIn, OpCodeAsmJs op, AsmJsRetType retType, ... ) :
        AsmJsFunctionDeclaration( name, symbolType, allocator )
        , mBuiltIn( builtIn )
        , mOverload( nullptr )
        , mOpCode(op)
    {
        bool ret = CheckAndSetReturnType(retType);
        Assert(ret);
        va_list arguments;

        SetArgCount( argCount );
        va_start( arguments, retType );
        for(ArgSlot iArg = 0; iArg < argCount; iArg++)
        {
            SetArgType(static_cast<AsmJsType::Which>(va_arg(arguments, int)), iArg);
        }
        va_end(arguments);
    }

    void AsmJsMathFunction::SetOverload(AsmJsMathFunction* val)
    {
#if DBG
        AsmJsMathFunction* over = val->mOverload;
        while (over)
        {
            if (over == this)
            {
                Assert(false);
                break;
            }
            over = over->mOverload;
        }
#endif
        Assert(val->GetSymbolType() == GetSymbolType());
        if (this->mOverload)
        {
            this->mOverload->SetOverload(val);
        }
        else
        {
            mOverload = val;
        }
    }